

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O3

int __thiscall Fl_Tree::draw_tree(Fl_Tree *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  Fl_Scrollbar *widget;
  int iVar10;
  Fl_Tree_Item *itemfocus;
  int iVar11;
  int iVar12;
  uint uVar13;
  int Y;
  
  fix_scrollbar_order(this);
  iVar12 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar1 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar9 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar2 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar3 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  iVar10 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar4 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  if (1 < (this->super_Fl_Group).super_Fl_Widget.damage_) {
    Fl_Widget::draw_box((Fl_Widget *)this);
    Fl_Widget::draw_label((Fl_Widget *)this);
  }
  if (this->_root == (Fl_Tree_Item *)0x0) {
    iVar12 = 0;
  }
  else {
    uVar8 = iVar1 + iVar12;
    uVar7 = iVar2 + iVar9;
    uVar13 = iVar11 - iVar3;
    iVar12 = (this->_prefs)._marginleft;
    iVar9 = 0;
    if (((this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
      iVar9 = (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_;
    }
    iVar9 = ((this->_prefs)._margintop + uVar7) - iVar9;
    iVar10 = iVar10 - iVar4;
    iVar11 = uVar13 - iVar12;
    iVar12 = iVar12 + uVar8;
    if ((this->_prefs)._connectorstyle == FL_TREE_CONNECTOR_NONE) {
      iVar1 = ((this->_prefs)._openimage)->w_;
      iVar12 = iVar12 - iVar1;
      iVar11 = iVar11 + iVar1;
    }
    Y = iVar9;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)uVar8,(ulong)uVar7,(ulong)uVar13);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
              (fl_graphics_driver,(ulong)(uint)(this->_prefs)._labelfont,
               (ulong)(uint)(this->_prefs)._labelsize);
    if ((Fl_Tree *)Fl::focus_ == this) {
      itemfocus = this->_item_focus;
    }
    else {
      itemfocus = (Fl_Tree_Item *)0x0;
    }
    Fl_Tree_Item::draw(this->_root,iVar12,&Y,iVar11,(Fl_Widget *)this,itemfocus,&this->_prefs,1);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    iVar12 = (iVar10 + uVar7) - Y;
    iVar11 = 0;
    if (0 < iVar12) {
      iVar11 = iVar12;
    }
    iVar11 = (Y - iVar9) + (this->_prefs)._margintop + iVar11;
    if (((iVar9 < (int)uVar7) || (iVar10 < iVar11)) ||
       (1 < (int)(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.value_)) {
      uVar7 = this->_scrollbar_size;
      if (uVar7 == 0) {
        uVar7 = Fl::scrollbar_size();
      }
      iVar9 = (this->super_Fl_Group).super_Fl_Widget.x_;
      iVar1 = (this->super_Fl_Group).super_Fl_Widget.w_;
      iVar4 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar2 = (this->super_Fl_Group).super_Fl_Widget.y_;
      iVar5 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      iVar3 = (this->super_Fl_Group).super_Fl_Widget.h_;
      iVar6 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[5])();
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
                (this->_vscroll,(ulong)((iVar9 + iVar1) - (iVar4 + uVar7)),
                 (ulong)(uint)(iVar2 + iVar5),(ulong)uVar7,(ulong)(uint)(iVar3 - iVar6));
      Fl_Slider::slider_size
                (&this->_vscroll->super_Fl_Slider,(double)((float)iVar10 / (float)iVar11));
      widget = this->_vscroll;
      (widget->super_Fl_Slider).super_Fl_Valuator.min = 0.0;
      (widget->super_Fl_Slider).super_Fl_Valuator.max = (double)(iVar11 - iVar10);
    }
    else {
      Fl_Valuator::value((Fl_Valuator *)this->_vscroll,0.0);
      (*(this->_vscroll->super_Fl_Slider).super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[6])();
      widget = this->_vscroll;
      iVar12 = 0;
    }
    Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)widget);
  }
  return iVar12;
}

Assistant:

int Fl_Tree::draw_tree() {
  int ret = 0;
  fix_scrollbar_order();
  // Let group draw box+label but *NOT* children.
  // We handle drawing children ourselves by calling each item's draw()
  //
  int cx = x() + Fl::box_dx(box());
  int cy = y() + Fl::box_dy(box());
  int cw = w() - Fl::box_dw(box());
  int ch = h() - Fl::box_dh(box());
  {
    // Handle group's bg
    if ( damage() & ~FL_DAMAGE_CHILD) {			// redraw entire widget?
      Fl_Group::draw_box();
      Fl_Group::draw_label();
    }
    if ( ! _root ) return(0);
    // These values are changed during drawing
    // By end, 'Y' will be the lowest point on the tree
    int X = cx + _prefs.marginleft();
    int Y = cy + _prefs.margintop() - (_vscroll->visible() ? _vscroll->value() : 0);
    int W = cw - _prefs.marginleft();			// - _prefs.marginright();
    // Adjust root's X/W if connectors off
    if (_prefs.connectorstyle() == FL_TREE_CONNECTOR_NONE) {
      X -= _prefs.openicon()->w();
      W += _prefs.openicon()->w();
    }
    int Ysave = Y;
    fl_push_clip(cx,cy,cw,ch);
    {
      fl_font(_prefs.labelfont(), _prefs.labelsize());
      _root->draw(X, Y, W, this,
		  (Fl::focus()==this)?_item_focus:0,	// show focus item ONLY if Fl_Tree has focus
		  _prefs);
    }
    fl_pop_clip();
    
    // Show vertical scrollbar?
    {
#if FLTK_ABI_VERSION >= 10301
      // NEW
      int SY = Y + _prefs.marginbottom();
#else /*FLTK_ABI_VERSION*/
      // OLD
      int SY = Y;
#endif /*FLTK_ABI_VERSION*/
      int ydiff = (SY+_prefs.margintop())-Ysave;		// ydiff=size of tree
      int ytoofar = (cy+ch) - SY;				// ytoofar -- if >0, scrolled beyond bottom
      if ( ytoofar > 0 ) ydiff += ytoofar;
      if ( Ysave<cy || ydiff>ch || int(_vscroll->value())>1 ) {
	_vscroll->visible();
	int scrollsize = _scrollbar_size ? _scrollbar_size : Fl::scrollbar_size();
	int sx = x()+w()-Fl::box_dx(box())-scrollsize;
	int sy = y()+Fl::box_dy(box());
	int sw = scrollsize;
	int sh = h()-Fl::box_dh(box());
	_vscroll->show();
	_vscroll->resize(sx,sy,sw,sh);
	_vscroll->slider_size(float(ch)/float(ydiff));
	_vscroll->range(0.0,ydiff-ch);
	ret = ytoofar;
      } else {
	_vscroll->Fl_Slider::value(0);
	_vscroll->hide();
	ret = 0;
      }
    }
  }
  draw_child(*_vscroll);	// draw scroll last
  return(ret);
}